

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall QAbstractItemView::updateGeometries(QAbstractItemView *this)

{
  QAbstractItemViewPrivate *this_00;
  
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  (**(code **)(*(long *)this + 0x260))();
  QBasicTimer::start(&this_00->fetchMoreTimer,(Duration)0x0,(QObject *)this);
  QAbstractItemViewPrivate::updateGeometry(this_00);
  return;
}

Assistant:

void QAbstractItemView::updateGeometries()
{
    Q_D(QAbstractItemView);
    updateEditorGeometries();
    d->fetchMoreTimer.start(0, this); //fetch more later
    d->updateGeometry();
}